

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_tlstree.c
# Opt level: O0

int main(void)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [11];
  undefined1 auVar6 [11];
  undefined1 auVar7 [12];
  undefined1 auVar8 [12];
  undefined1 auVar9 [13];
  undefined1 auVar10 [13];
  undefined1 auVar11 [14];
  undefined1 auVar12 [14];
  int iVar13;
  int iVar14;
  EVP_MD_CTX *pEVar15;
  char *pcVar16;
  EVP_MD *type;
  FILE *pFVar17;
  EVP_CIPHER *cipher;
  EVP_CIPHER_CTX *ctx;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  char cVar24;
  char cVar25;
  char cVar26;
  char cVar27;
  char cVar28;
  char cVar29;
  char cVar30;
  char cVar31;
  char cVar32;
  byte bVar33;
  int i;
  size_t mac_len;
  EVP_PKEY *mac_key;
  EVP_CIPHER *ciph;
  EVP_MD *md;
  EVP_CIPHER_CTX *enc;
  EVP_MD_CTX *mdctx;
  uchar mac63 [16];
  uchar data63_processed [4112];
  uchar enc63_etl_tail [48];
  uchar enc63_etl_head [32];
  uchar mac63_etl [16];
  uchar data63 [4096];
  uchar rec63_header [5];
  uchar seq63 [8];
  uchar mac0 [16];
  uchar data0_processed [31];
  uchar enc0_etl [31];
  uchar mac0_etl [16];
  uchar data0 [15];
  uchar rec0_header [5];
  uchar seq0 [8];
  uchar full_iv [16];
  uchar enc_key [32];
  uchar mac_secret [32];
  int in_stack_ffffffffffffde5c;
  undefined4 in_stack_ffffffffffffde60;
  undefined4 in_stack_ffffffffffffde64;
  char *in_stack_ffffffffffffde68;
  uchar local_2168;
  char cStack_2167;
  char cStack_2166;
  char cStack_2165;
  char cStack_2164;
  char cStack_2163;
  char cStack_2162;
  char cStack_2161;
  char cStack_2160;
  char cStack_215f;
  char cStack_215e;
  char cStack_215d;
  char cStack_215c;
  char cStack_215b;
  char cStack_215a;
  char cStack_2159;
  uchar local_2158 [4064];
  undefined1 auStack_1178 [32];
  uchar auStack_1158 [16];
  undefined1 local_1148 [48];
  undefined8 local_1118;
  undefined8 local_1110;
  undefined8 local_1108;
  undefined8 local_1100;
  undefined8 local_10f8;
  undefined8 uStack_10f0;
  uchar local_10e8 [4099];
  undefined4 local_e5;
  undefined1 local_e1;
  char local_e0 [9];
  char cStack_d7;
  char cStack_d6;
  char cStack_d5;
  char cStack_d4;
  char cStack_d3;
  char cStack_d2;
  char cStack_d1;
  char cStack_d0;
  char cStack_cf;
  char cStack_ce;
  char cStack_cd;
  char cStack_cc;
  char cStack_cb;
  char cStack_ca;
  char cStack_c9;
  uchar local_c8 [15];
  uchar auStack_b9 [17];
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined4 local_90;
  undefined2 local_8c;
  undefined1 local_8a;
  undefined8 local_88;
  undefined8 uStack_80;
  uchar local_74 [15];
  undefined4 local_65;
  undefined1 local_61;
  char local_60 [8];
  uchar local_58 [16];
  uchar local_48 [32];
  uchar local_28 [36];
  undefined4 local_4;
  
  local_4 = 0;
  local_28[0] = 0xff;
  local_28[1] = 0xff;
  local_28[2] = 0xff;
  local_28[3] = 0xff;
  local_28[4] = 0xff;
  local_28[5] = 0xff;
  local_28[6] = 0xff;
  local_28[7] = 0xff;
  local_28[8] = 0xff;
  local_28[9] = 0xff;
  local_28[10] = 0xff;
  local_28[0xb] = 0xff;
  local_28[0xc] = 0xff;
  local_28[0xd] = 0xff;
  local_28[0xe] = 0xff;
  local_28[0xf] = 0xff;
  local_28[0x10] = 0xff;
  local_28[0x11] = 0xff;
  local_28[0x12] = 0xff;
  local_28[0x13] = 0xff;
  local_28[0x14] = 0xff;
  local_28[0x15] = 0xff;
  local_28[0x16] = 0xff;
  local_28[0x17] = 0xff;
  local_28[0x18] = 0xff;
  local_28[0x19] = 0xff;
  local_28[0x1a] = 0xff;
  local_28[0x1b] = 0xff;
  local_28[0x1c] = 0xff;
  local_28[0x1d] = 0xff;
  local_28[0x1e] = 0xff;
  local_28[0x1f] = 0xff;
  memset(local_48,0,0x20);
  memset(local_58,0,0x10);
  memset(local_60,0,8);
  local_65 = 0x30317;
  local_61 = 0xf;
  memset(local_74,0,0xf);
  local_88 = 0x49b93bc7cb095375;
  uStack_80 = 0xee0f0a1686bb0ec5;
  local_a8 = 0x3b43ce3a1da717f3;
  local_a0 = 0xae61efd4e7d401;
  local_98 = 0xdf1e267a52413bd5;
  local_90 = 0x5778bac2;
  local_8c = 0x93c1;
  local_8a = 0x2d;
  local_e0[0] = '\0';
  local_e0[1] = '\0';
  local_e0[2] = '\0';
  local_e0[3] = '\0';
  local_e0[4] = '\0';
  local_e0[5] = '\0';
  local_e0[6] = '\0';
  local_e0[7] = '?';
  local_e5 = 0x10030317;
  local_e1 = 0;
  local_10f8 = 0xd8d8cd0f43fd3b0a;
  uStack_10f0 = 0x7d4f78818646965c;
  local_1118 = 0x4da0d5a0b038186a;
  local_1110 = 0xb75f086d8964291f;
  local_1108 = 0xdc5c9fc376d784da;
  local_1100 = 0x9d13ef59b5b72037;
  memcpy(local_1148,&DAT_00102080,0x30);
  pEVar15 = (EVP_MD_CTX *)EVP_MD_CTX_new();
  OPENSSL_init_crypto(0x40);
  memset(local_10e8,0,0x1000);
  pcVar16 = OBJ_nid2sn(0x3f9);
  type = EVP_get_digestbyname(pcVar16);
  EVP_DigestInit_ex(pEVar15,type,(ENGINE *)0x0);
  pFVar17 = (FILE *)EVP_PKEY_new_mac_key(0x3f9,(ENGINE *)0x0,local_28,0x20);
  EVP_DigestSignInit(pEVar15,(EVP_PKEY_CTX **)0x0,type,(ENGINE *)0x0,(EVP_PKEY *)pFVar17);
  EVP_PKEY_free((EVP_PKEY *)pFVar17);
  EVP_MD_CTX_ctrl(pEVar15,4,0,local_60);
  EVP_DigestSignUpdate(pEVar15,local_60,8);
  EVP_DigestSignUpdate(pEVar15,&local_65,5);
  EVP_DigestSignUpdate(pEVar15,local_74,0xf);
  EVP_DigestSignFinal(pEVar15,(uchar *)(local_e0 + 8),(size_t *)&stack0xffffffffffffde68);
  EVP_MD_CTX_free(pEVar15);
  hexdump(pFVar17,in_stack_ffffffffffffde68,
          (uchar *)CONCAT44(in_stack_ffffffffffffde64,in_stack_ffffffffffffde60),
          in_stack_ffffffffffffde5c);
  cVar18 = -(local_e0[8] == (char)local_88);
  cVar19 = -(cStack_d7 == (char)((ulong)local_88 >> 8));
  cVar20 = -(cStack_d6 == (char)((ulong)local_88 >> 0x10));
  cVar21 = -(cStack_d5 == (char)((ulong)local_88 >> 0x18));
  cVar22 = -(cStack_d4 == (char)((ulong)local_88 >> 0x20));
  cVar23 = -(cStack_d3 == (char)((ulong)local_88 >> 0x28));
  cVar24 = -(cStack_d2 == (char)((ulong)local_88 >> 0x30));
  cVar25 = -(cStack_d1 == (char)((ulong)local_88 >> 0x38));
  cVar26 = -(cStack_d0 == (char)uStack_80);
  cVar27 = -(cStack_cf == (char)((ulong)uStack_80 >> 8));
  cVar28 = -(cStack_ce == (char)((ulong)uStack_80 >> 0x10));
  cVar29 = -(cStack_cd == (char)((ulong)uStack_80 >> 0x18));
  cVar30 = -(cStack_cc == (char)((ulong)uStack_80 >> 0x20));
  cVar31 = -(cStack_cb == (char)((ulong)uStack_80 >> 0x28));
  cVar32 = -(cStack_ca == (char)((ulong)uStack_80 >> 0x30));
  bVar33 = -(cStack_c9 == (char)((ulong)uStack_80 >> 0x38));
  auVar1[1] = cVar19;
  auVar1[0] = cVar18;
  auVar1[2] = cVar20;
  auVar1[3] = cVar21;
  auVar1[4] = cVar22;
  auVar1[5] = cVar23;
  auVar1[6] = cVar24;
  auVar1[7] = cVar25;
  auVar1[8] = cVar26;
  auVar1[9] = cVar27;
  auVar1[10] = cVar28;
  auVar1[0xb] = cVar29;
  auVar1[0xc] = cVar30;
  auVar1[0xd] = cVar31;
  auVar1[0xe] = cVar32;
  auVar1[0xf] = bVar33;
  auVar2[1] = cVar19;
  auVar2[0] = cVar18;
  auVar2[2] = cVar20;
  auVar2[3] = cVar21;
  auVar2[4] = cVar22;
  auVar2[5] = cVar23;
  auVar2[6] = cVar24;
  auVar2[7] = cVar25;
  auVar2[8] = cVar26;
  auVar2[9] = cVar27;
  auVar2[10] = cVar28;
  auVar2[0xb] = cVar29;
  auVar2[0xc] = cVar30;
  auVar2[0xd] = cVar31;
  auVar2[0xe] = cVar32;
  auVar2[0xf] = bVar33;
  auVar11[1] = cVar21;
  auVar11[0] = cVar20;
  auVar11[2] = cVar22;
  auVar11[3] = cVar23;
  auVar11[4] = cVar24;
  auVar11[5] = cVar25;
  auVar11[6] = cVar26;
  auVar11[7] = cVar27;
  auVar11[8] = cVar28;
  auVar11[9] = cVar29;
  auVar11[10] = cVar30;
  auVar11[0xb] = cVar31;
  auVar11[0xc] = cVar32;
  auVar11[0xd] = bVar33;
  auVar9[1] = cVar22;
  auVar9[0] = cVar21;
  auVar9[2] = cVar23;
  auVar9[3] = cVar24;
  auVar9[4] = cVar25;
  auVar9[5] = cVar26;
  auVar9[6] = cVar27;
  auVar9[7] = cVar28;
  auVar9[8] = cVar29;
  auVar9[9] = cVar30;
  auVar9[10] = cVar31;
  auVar9[0xb] = cVar32;
  auVar9[0xc] = bVar33;
  auVar7[1] = cVar23;
  auVar7[0] = cVar22;
  auVar7[2] = cVar24;
  auVar7[3] = cVar25;
  auVar7[4] = cVar26;
  auVar7[5] = cVar27;
  auVar7[6] = cVar28;
  auVar7[7] = cVar29;
  auVar7[8] = cVar30;
  auVar7[9] = cVar31;
  auVar7[10] = cVar32;
  auVar7[0xb] = bVar33;
  auVar5[1] = cVar24;
  auVar5[0] = cVar23;
  auVar5[2] = cVar25;
  auVar5[3] = cVar26;
  auVar5[4] = cVar27;
  auVar5[5] = cVar28;
  auVar5[6] = cVar29;
  auVar5[7] = cVar30;
  auVar5[8] = cVar31;
  auVar5[9] = cVar32;
  auVar5[10] = bVar33;
  if ((ushort)((ushort)(SUB161(auVar1 >> 7,0) & 1) | (ushort)(SUB161(auVar2 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB141(auVar11 >> 7,0) & 1) << 2 | (ushort)(SUB131(auVar9 >> 7,0) & 1) << 3
               | (ushort)(SUB121(auVar7 >> 7,0) & 1) << 4 | (ushort)(SUB111(auVar5 >> 7,0) & 1) << 5
               | (ushort)((byte)(CONCAT19(bVar33,CONCAT18(cVar32,CONCAT17(cVar31,CONCAT16(cVar30,
                                                  CONCAT15(cVar29,CONCAT14(cVar28,CONCAT13(cVar27,
                                                  CONCAT12(cVar26,CONCAT11(cVar25,cVar24))))))))) >>
                                7) & 1) << 6 |
               (ushort)((byte)(CONCAT18(bVar33,CONCAT17(cVar32,CONCAT16(cVar31,CONCAT15(cVar30,
                                                  CONCAT14(cVar29,CONCAT13(cVar28,CONCAT12(cVar27,
                                                  CONCAT11(cVar26,cVar25)))))))) >> 7) & 1) << 7 |
              (ushort)(bVar33 >> 7) << 0xf) != 0xffff) {
    fprintf(_stderr,"MAC0 mismatch");
    exit(1);
  }
  pcVar16 = OBJ_nid2sn(0x499);
  cipher = EVP_get_cipherbyname(pcVar16);
  ctx = EVP_CIPHER_CTX_new();
  iVar13 = EVP_EncryptInit_ex(ctx,cipher,(ENGINE *)0x0,local_48,local_58);
  if (iVar13 < 1) {
    fprintf(_stderr,"Internal error");
    exit(1);
  }
  for (iVar13 = 7;
      (-1 < iVar13 && (local_60[iVar13] = local_60[iVar13] + '\x01', local_60[iVar13] == '\0'));
      iVar13 = iVar13 + -1) {
  }
  EVP_CIPHER_CTX_ctrl(ctx,0x2a,0,local_60);
  EVP_Cipher(ctx,local_c8,local_74,0xf);
  EVP_Cipher(ctx,auStack_b9,(uchar *)(local_e0 + 8),0x10);
  hexdump(pFVar17,in_stack_ffffffffffffde68,(uchar *)CONCAT44(iVar13,in_stack_ffffffffffffde60),
          in_stack_ffffffffffffde5c);
  iVar14 = memcmp(&local_a8,local_c8,0x1f);
  if (iVar14 != 0) {
    fprintf(_stderr,"ENC0 mismatch");
    exit(1);
  }
  pEVar15 = (EVP_MD_CTX *)EVP_MD_CTX_new();
  EVP_DigestInit_ex(pEVar15,type,(ENGINE *)0x0);
  pFVar17 = (FILE *)EVP_PKEY_new_mac_key(0x3f9,(ENGINE *)0x0,local_28,0x20);
  EVP_DigestSignInit(pEVar15,(EVP_PKEY_CTX **)0x0,type,(ENGINE *)0x0,(EVP_PKEY *)pFVar17);
  EVP_PKEY_free((EVP_PKEY *)pFVar17);
  EVP_MD_CTX_ctrl(pEVar15,4,0,local_e0);
  EVP_DigestSignUpdate(pEVar15,local_e0,8);
  EVP_DigestSignUpdate(pEVar15,&local_e5,5);
  EVP_DigestSignUpdate(pEVar15,local_10e8,0x1000);
  EVP_DigestSignFinal(pEVar15,&local_2168,(size_t *)&stack0xffffffffffffde68);
  EVP_MD_CTX_free(pEVar15);
  hexdump(pFVar17,in_stack_ffffffffffffde68,(uchar *)CONCAT44(iVar13,in_stack_ffffffffffffde60),
          in_stack_ffffffffffffde5c);
  cVar18 = -(local_2168 == (uchar)local_10f8);
  cVar19 = -(cStack_2167 == (char)((ulong)local_10f8 >> 8));
  cVar20 = -(cStack_2166 == (char)((ulong)local_10f8 >> 0x10));
  cVar21 = -(cStack_2165 == (char)((ulong)local_10f8 >> 0x18));
  cVar22 = -(cStack_2164 == (char)((ulong)local_10f8 >> 0x20));
  cVar23 = -(cStack_2163 == (char)((ulong)local_10f8 >> 0x28));
  cVar24 = -(cStack_2162 == (char)((ulong)local_10f8 >> 0x30));
  cVar25 = -(cStack_2161 == (char)((ulong)local_10f8 >> 0x38));
  cVar26 = -(cStack_2160 == (char)uStack_10f0);
  cVar27 = -(cStack_215f == (char)((ulong)uStack_10f0 >> 8));
  cVar28 = -(cStack_215e == (char)((ulong)uStack_10f0 >> 0x10));
  cVar29 = -(cStack_215d == (char)((ulong)uStack_10f0 >> 0x18));
  cVar30 = -(cStack_215c == (char)((ulong)uStack_10f0 >> 0x20));
  cVar31 = -(cStack_215b == (char)((ulong)uStack_10f0 >> 0x28));
  cVar32 = -(cStack_215a == (char)((ulong)uStack_10f0 >> 0x30));
  bVar33 = -(cStack_2159 == (char)((ulong)uStack_10f0 >> 0x38));
  auVar3[1] = cVar19;
  auVar3[0] = cVar18;
  auVar3[2] = cVar20;
  auVar3[3] = cVar21;
  auVar3[4] = cVar22;
  auVar3[5] = cVar23;
  auVar3[6] = cVar24;
  auVar3[7] = cVar25;
  auVar3[8] = cVar26;
  auVar3[9] = cVar27;
  auVar3[10] = cVar28;
  auVar3[0xb] = cVar29;
  auVar3[0xc] = cVar30;
  auVar3[0xd] = cVar31;
  auVar3[0xe] = cVar32;
  auVar3[0xf] = bVar33;
  auVar4[1] = cVar19;
  auVar4[0] = cVar18;
  auVar4[2] = cVar20;
  auVar4[3] = cVar21;
  auVar4[4] = cVar22;
  auVar4[5] = cVar23;
  auVar4[6] = cVar24;
  auVar4[7] = cVar25;
  auVar4[8] = cVar26;
  auVar4[9] = cVar27;
  auVar4[10] = cVar28;
  auVar4[0xb] = cVar29;
  auVar4[0xc] = cVar30;
  auVar4[0xd] = cVar31;
  auVar4[0xe] = cVar32;
  auVar4[0xf] = bVar33;
  auVar12[1] = cVar21;
  auVar12[0] = cVar20;
  auVar12[2] = cVar22;
  auVar12[3] = cVar23;
  auVar12[4] = cVar24;
  auVar12[5] = cVar25;
  auVar12[6] = cVar26;
  auVar12[7] = cVar27;
  auVar12[8] = cVar28;
  auVar12[9] = cVar29;
  auVar12[10] = cVar30;
  auVar12[0xb] = cVar31;
  auVar12[0xc] = cVar32;
  auVar12[0xd] = bVar33;
  auVar10[1] = cVar22;
  auVar10[0] = cVar21;
  auVar10[2] = cVar23;
  auVar10[3] = cVar24;
  auVar10[4] = cVar25;
  auVar10[5] = cVar26;
  auVar10[6] = cVar27;
  auVar10[7] = cVar28;
  auVar10[8] = cVar29;
  auVar10[9] = cVar30;
  auVar10[10] = cVar31;
  auVar10[0xb] = cVar32;
  auVar10[0xc] = bVar33;
  auVar8[1] = cVar23;
  auVar8[0] = cVar22;
  auVar8[2] = cVar24;
  auVar8[3] = cVar25;
  auVar8[4] = cVar26;
  auVar8[5] = cVar27;
  auVar8[6] = cVar28;
  auVar8[7] = cVar29;
  auVar8[8] = cVar30;
  auVar8[9] = cVar31;
  auVar8[10] = cVar32;
  auVar8[0xb] = bVar33;
  auVar6[1] = cVar24;
  auVar6[0] = cVar23;
  auVar6[2] = cVar25;
  auVar6[3] = cVar26;
  auVar6[4] = cVar27;
  auVar6[5] = cVar28;
  auVar6[6] = cVar29;
  auVar6[7] = cVar30;
  auVar6[8] = cVar31;
  auVar6[9] = cVar32;
  auVar6[10] = bVar33;
  if ((ushort)((ushort)(SUB161(auVar3 >> 7,0) & 1) | (ushort)(SUB161(auVar4 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB141(auVar12 >> 7,0) & 1) << 2 | (ushort)(SUB131(auVar10 >> 7,0) & 1) << 3
               | (ushort)(SUB121(auVar8 >> 7,0) & 1) << 4 | (ushort)(SUB111(auVar6 >> 7,0) & 1) << 5
               | (ushort)((byte)(CONCAT19(bVar33,CONCAT18(cVar32,CONCAT17(cVar31,CONCAT16(cVar30,
                                                  CONCAT15(cVar29,CONCAT14(cVar28,CONCAT13(cVar27,
                                                  CONCAT12(cVar26,CONCAT11(cVar25,cVar24))))))))) >>
                                7) & 1) << 6 |
               (ushort)((byte)(CONCAT18(bVar33,CONCAT17(cVar32,CONCAT16(cVar31,CONCAT15(cVar30,
                                                  CONCAT14(cVar29,CONCAT13(cVar28,CONCAT12(cVar27,
                                                  CONCAT11(cVar26,cVar25)))))))) >> 7) & 1) << 7 |
              (ushort)(bVar33 >> 7) << 0xf) != 0xffff) {
    fprintf(_stderr,"MAC63 mismatch");
    exit(1);
  }
  for (iVar13 = 7;
      (-1 < iVar13 && (local_e0[iVar13] = local_e0[iVar13] + '\x01', local_e0[iVar13] == '\0'));
      iVar13 = iVar13 + -1) {
  }
  EVP_CIPHER_CTX_ctrl(ctx,0x2a,0,local_e0);
  EVP_Cipher(ctx,local_2158,local_10e8,0x1000);
  EVP_Cipher(ctx,auStack_1158,&local_2168,0x10);
  hexdump(pFVar17,in_stack_ffffffffffffde68,(uchar *)CONCAT44(iVar13,in_stack_ffffffffffffde60),
          in_stack_ffffffffffffde5c);
  iVar14 = memcmp(&local_1118,local_2158,0x20);
  if (iVar14 == 0) {
    hexdump(pFVar17,in_stack_ffffffffffffde68,(uchar *)CONCAT44(iVar13,in_stack_ffffffffffffde60),
            in_stack_ffffffffffffde5c);
    iVar13 = memcmp(local_1148,auStack_1178,0x30);
    if (iVar13 == 0) {
      return 0;
    }
    fprintf(_stderr,"ENC63 mismatch: tail");
    exit(1);
  }
  fprintf(_stderr,"ENC63 mismatch: head");
  exit(1);
}

Assistant:

int main(void)
{
#ifdef EVP_MD_CTRL_TLSTREE
	const unsigned char mac_secret[] = {
0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF,
0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF,
	};

	const unsigned char enc_key[] = {
0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
	};

	const unsigned char full_iv[] = {
		0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
		0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
	};


	unsigned char seq0[] = {
		0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
	};

	const unsigned char rec0_header[] = {
0x17, 0x03, 0x03, 0x00, 0x0F
	};

	const unsigned char data0[15] = {
0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00
	};

	const unsigned char mac0_etl[16] = {
0x75, 0x53, 0x09, 0xCB, 0xC7, 0x3B, 0xB9, 0x49, 0xC5, 0x0E, 0xBB, 0x86, 0x16, 0x0A, 0x0F, 0xEE
	};

	const unsigned char enc0_etl[31] = {
0xf3, 0x17, 0xa7, 0x1d, 0x3a, 0xce, 0x43, 0x3b, 0x01, 0xd4, 0xe7, 0xd4, 0xef, 0x61, 0xae, 0x00,
0xd5, 0x3b, 0x41, 0x52, 0x7a, 0x26, 0x1e, 0xdf, 0xc2, 0xba, 0x78, 0x57, 0xc1, 0x93, 0x2d
	};

	unsigned char data0_processed[31];
	unsigned char mac0[16];

	unsigned char seq63[] = {
		0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x3F,
	};

	const unsigned char rec63_header[] = {
0x17, 0x03, 0x03, 0x10, 0x00
	};

	unsigned char data63[4096];

	const unsigned char mac63_etl[16] = {
0x0A, 0x3B, 0xFD, 0x43, 0x0F, 0xCD, 0xD8, 0xD8, 0x5C, 0x96, 0x46, 0x86, 0x81, 0x78, 0x4F, 0x7D
	};

	const unsigned char enc63_etl_head[32] = {
0x6A, 0x18, 0x38, 0xB0, 0xA0, 0xD5, 0xA0, 0x4D, 0x1F, 0x29, 0x64, 0x89, 0x6D, 0x08, 0x5F, 0xB7, 
0xDA, 0x84, 0xD7, 0x76, 0xC3, 0x9F, 0x5C, 0xDC, 0x37, 0x20, 0xB7, 0xB5, 0x59, 0xEF, 0x13, 0x9D
	};
	const unsigned char enc63_etl_tail[48] = {
0x0A, 0x81, 0x29, 0x9B, 0x35, 0x98, 0x19, 0x5D, 0xD4, 0x51, 0x68, 0xA6, 0x38, 0x50, 0xA7, 0x6E, 
0x1A, 0x4F, 0x1E, 0x6D, 0xD5, 0xEF, 0x72, 0x59, 0x3F, 0xAE, 0x76, 0x55, 0x71, 0xEC, 0x37, 0xE7, 
0x17, 0xF5, 0xB8, 0x62, 0x85, 0xBB, 0x5B, 0xFD, 0x83, 0xB6, 0x6A, 0xB7, 0x63, 0x86, 0x52, 0x08
	};

	unsigned char data63_processed[4096+16];
	unsigned char mac63[16];

	EVP_MD_CTX *mdctx = EVP_MD_CTX_new();
	EVP_CIPHER_CTX *enc = NULL;
	const EVP_MD *md;
	const EVP_CIPHER *ciph;
	EVP_PKEY *mac_key;
	size_t mac_len;
	int i;

	OPENSSL_init_crypto(OPENSSL_INIT_LOAD_CONFIG, NULL);

	memset(data63, 0, 4096);

	md = EVP_get_digestbynid(NID_grasshopper_mac);

	EVP_DigestInit_ex(mdctx, md, NULL);
  mac_key = EVP_PKEY_new_mac_key(NID_grasshopper_mac, NULL, mac_secret, 32);
  EVP_DigestSignInit(mdctx, NULL, md, NULL, mac_key);
  EVP_PKEY_free(mac_key);

	EVP_MD_CTX_ctrl(mdctx, EVP_MD_CTRL_TLSTREE, 0, seq0);
	EVP_DigestSignUpdate(mdctx, seq0, 8);
	EVP_DigestSignUpdate(mdctx, rec0_header, 5);
	EVP_DigestSignUpdate(mdctx, data0, 15);
	EVP_DigestSignFinal(mdctx, mac0, &mac_len);

	EVP_MD_CTX_free(mdctx);
	hexdump(stderr, "MAC0 result", mac0, mac_len);
	if (memcmp(mac0, mac0_etl, 16) != 0) {
		fprintf(stderr, "MAC0 mismatch");
		exit(1);
	}

	ciph = EVP_get_cipherbynid(NID_id_tc26_cipher_gostr3412_2015_kuznyechik_ctracpkm);
	enc = EVP_CIPHER_CTX_new();
	if (EVP_EncryptInit_ex(enc, ciph, NULL, enc_key, full_iv) <= 0) {
		fprintf(stderr, "Internal error");
		exit(1);
	}

	for (i = 7; i >= 0; i--) {
		++seq0[i];
		if (seq0[i] != 0)
			break;
	}
	EVP_CIPHER_CTX_ctrl(enc, EVP_CTRL_TLSTREE, 0, seq0);
	EVP_Cipher(enc, data0_processed, data0, sizeof(data0));
	EVP_Cipher(enc, data0_processed+sizeof(data0), mac0, 16);

	hexdump(stderr, "ENC0 result", data0_processed, 31);
	if (memcmp(enc0_etl, data0_processed, sizeof(data0_processed)) != 0) {
		fprintf(stderr, "ENC0 mismatch");
		exit(1);
	}

	mdctx = EVP_MD_CTX_new();
	EVP_DigestInit_ex(mdctx, md, NULL);
  mac_key = EVP_PKEY_new_mac_key(NID_grasshopper_mac, NULL, mac_secret, 32);
  EVP_DigestSignInit(mdctx, NULL, md, NULL, mac_key);
  EVP_PKEY_free(mac_key);

	EVP_MD_CTX_ctrl(mdctx, EVP_MD_CTRL_TLSTREE, 0, seq63);
	EVP_DigestSignUpdate(mdctx, seq63, 8);
	EVP_DigestSignUpdate(mdctx, rec63_header, 5);
	EVP_DigestSignUpdate(mdctx, data63, 4096);
	EVP_DigestSignFinal(mdctx, mac63, &mac_len);

	EVP_MD_CTX_free(mdctx);
	hexdump(stderr, "MAC63 result", mac63, mac_len);
	if (memcmp(mac63, mac63_etl, 16) != 0) {
		fprintf(stderr, "MAC63 mismatch");
		exit(1);
	}

	for (i = 7; i >= 0; i--) {
		++seq63[i];
		if (seq63[i] != 0)
			break;
	}
	EVP_CIPHER_CTX_ctrl(enc, EVP_CTRL_TLSTREE, 0, seq63);
	EVP_Cipher(enc, data63_processed, data63, sizeof(data63));
	EVP_Cipher(enc, data63_processed+sizeof(data63), mac63, 16);

	hexdump(stderr, "ENC63 result: head", data63_processed, 32);
	if (memcmp(enc63_etl_head, data63_processed, sizeof(enc63_etl_head)) != 0) {
		fprintf(stderr, "ENC63 mismatch: head");
		exit(1);
	}
	hexdump(stderr, "ENC63 result: tail", data63_processed+4096+16-48, 48);
	if (memcmp(enc63_etl_tail, data63_processed+4096+16-48, sizeof(enc63_etl_tail)) != 0) {
		fprintf(stderr, "ENC63 mismatch: tail");
		exit(1);
	}

#endif
	return 0;
}